

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

char out_parse_entity(char *outbuf,size_t outbuf_size,char **sp,size_t *slenp)

{
  ushort uVar1;
  long lVar2;
  char *pcVar3;
  char **ppcVar4;
  long *plVar5;
  byte *pbVar6;
  size_t sVar7;
  ushort **ppuVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  amp_tbl_t *paVar12;
  byte bVar13;
  byte bVar14;
  char cVar15;
  uint uVar16;
  uint html4_char;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  char ampbuf [10];
  byte local_5a [10];
  long local_50;
  char *local_48;
  char **local_40;
  long *local_38;
  
  lVar2 = *(long *)outbuf_size;
  pcVar3 = *sp;
  if (pcVar3 == (char *)0x0) {
    bVar13 = 0;
  }
  else {
    *sp = pcVar3 + -1;
    pbVar6 = *(byte **)outbuf_size;
    *(byte **)outbuf_size = pbVar6 + 1;
    bVar13 = *pbVar6;
  }
  if (bVar13 == 0x23) {
    if (*sp == (char *)0x0) {
      bVar13 = 0;
    }
    else {
      *sp = *sp + -1;
      pbVar6 = *(byte **)outbuf_size;
      *(byte **)outbuf_size = pbVar6 + 1;
      bVar13 = *pbVar6;
    }
    if ((bVar13 & 0xdf) == 0x58) {
      if (*sp == (char *)0x0) {
        bVar13 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar6 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar6 + 1;
        bVar13 = *pbVar6;
      }
      ppuVar8 = __ctype_b_loc();
      uVar1 = (*ppuVar8)[bVar13];
      html4_char = 0;
      if ((uVar1 >> 0xc & 1) != 0) {
        html4_char = 0;
        do {
          if (((char)bVar13 < '\0') || ((uVar1 & 0x800) == 0)) {
            if ((byte)(bVar13 + 0x9f) < 6) {
              iVar10 = (char)bVar13 + -0x57;
            }
            else {
              iVar10 = (char)bVar13 + -0x37;
            }
          }
          else {
            iVar10 = bVar13 - 0x30;
          }
          if (*sp == (char *)0x0) {
            bVar13 = 0;
          }
          else {
            *sp = *sp + -1;
            pbVar6 = *(byte **)outbuf_size;
            *(byte **)outbuf_size = pbVar6 + 1;
            bVar13 = *pbVar6;
          }
          html4_char = html4_char * 0x10 + iVar10;
          uVar1 = (*ppuVar8)[bVar13];
        } while ((uVar1 >> 0xc & 1) != 0);
      }
    }
    else {
      uVar16 = 0;
      html4_char = 0;
      if (-1 < (char)bVar13) {
        ppuVar8 = __ctype_b_loc();
        bVar14 = bVar13;
        do {
          bVar13 = bVar14;
          html4_char = uVar16;
          if ((*(byte *)((long)*ppuVar8 + (ulong)bVar14 * 2 + 1) & 8) == 0) break;
          if (*sp == (char *)0x0) {
            bVar13 = 0;
          }
          else {
            *sp = *sp + -1;
            pbVar6 = *(byte **)outbuf_size;
            *(byte **)outbuf_size = pbVar6 + 1;
            bVar13 = *pbVar6;
          }
          uVar16 = ((uint)bVar14 + uVar16 * 10) - 0x30;
          bVar14 = bVar13;
          html4_char = uVar16;
        } while (-1 < (char)bVar13);
      }
    }
    if (bVar13 == 0x3b) {
      if (*sp == (char *)0x0) {
        bVar13 = 0;
      }
      else {
        *sp = *sp + -1;
        pbVar6 = *(byte **)outbuf_size;
        *(byte **)outbuf_size = pbVar6 + 1;
        bVar13 = *pbVar6;
      }
    }
  }
  else {
    local_50 = lVar2;
    local_48 = pcVar3;
    local_40 = sp;
    local_38 = (long *)outbuf_size;
    if ((char)bVar13 < '\x01') {
      pbVar6 = local_5a;
    }
    else {
      uVar11 = 0;
      ppuVar8 = __ctype_b_loc();
      do {
        if (((((*ppuVar8)[bVar13] >> 0xb & 1) == 0) && (((*ppuVar8)[bVar13] >> 10 & 1) == 0)) ||
           (8 < uVar11)) break;
        local_5a[uVar11] = bVar13;
        if (*sp == (char *)0x0) {
          bVar13 = 0;
        }
        else {
          *sp = *sp + -1;
          pbVar6 = *(byte **)outbuf_size;
          *(byte **)outbuf_size = pbVar6 + 1;
          bVar13 = *pbVar6;
        }
        uVar11 = uVar11 + 1;
      } while ('\0' < (char)bVar13);
      pbVar6 = local_5a + uVar11;
    }
    *pbVar6 = 0;
    uVar19 = 0x131;
    uVar11 = 0;
    do {
      paVar12 = (amp_tbl_t *)0x0;
      bVar20 = false;
      if ((uVar11 < 0x132) && (uVar17 = uVar19 - uVar11, uVar11 <= uVar19)) {
        uVar18 = (uVar17 >> 1) + uVar11;
        paVar12 = amp_tbl + uVar18;
        iVar10 = strcmp(paVar12->cname,(char *)local_5a);
        if (iVar10 == 0) {
LAB_00130ca0:
          bVar20 = false;
        }
        else {
          if (iVar10 < 1) {
            uVar11 = uVar11 + 1;
            if (1 < uVar17) {
              uVar11 = uVar18;
            }
          }
          else {
            if (uVar19 == 0 && uVar18 == 0) {
              paVar12 = (amp_tbl_t *)0x0;
              goto LAB_00130ca0;
            }
            bVar20 = uVar18 != uVar19;
            uVar19 = uVar19 - 1;
            if (bVar20) {
              uVar19 = uVar18;
            }
          }
          bVar20 = true;
        }
      }
      plVar5 = local_38;
      ppcVar4 = local_40;
      pcVar3 = local_48;
      lVar2 = local_50;
    } while (bVar20);
    if (bVar13 == 0x3b) {
      if (*local_40 == (char *)0x0) {
        bVar13 = 0;
      }
      else {
        *local_40 = *local_40 + -1;
        pbVar6 = (byte *)*local_38;
        *local_38 = (long)(pbVar6 + 1);
        bVar13 = *pbVar6;
      }
    }
    else if (paVar12 != (amp_tbl_t *)0x0) {
      sVar7 = strlen(paVar12->cname);
      *plVar5 = lVar2;
      *ppcVar4 = pcVar3;
      uVar16 = (uint)sVar7;
      while (uVar16 != 0) {
        if (*ppcVar4 == (char *)0x0) {
          bVar13 = 0;
        }
        else {
          *ppcVar4 = *ppcVar4 + -1;
          pbVar6 = (byte *)*plVar5;
          *plVar5 = (long)(pbVar6 + 1);
          bVar13 = *pbVar6;
        }
        uVar16 = (int)sVar7 - 1;
        sVar7 = (size_t)uVar16;
      }
    }
    if (paVar12 == (amp_tbl_t *)0x0) {
      *plVar5 = lVar2;
      *ppcVar4 = pcVar3;
      if (pcVar3 == (char *)0x0) {
        cVar15 = '\0';
      }
      else {
        *ppcVar4 = pcVar3 + -1;
        pcVar3 = (char *)*plVar5;
        *plVar5 = (long)(pcVar3 + 1);
        cVar15 = *pcVar3;
      }
      outbuf[0] = '&';
      outbuf[1] = '\0';
      return cVar15;
    }
    pcVar3 = paVar12->expan;
    if (pcVar3 != (char *)0x0) {
      sVar9 = strlen(pcVar3);
      sVar7 = 0x31;
      if (sVar9 < 0x31) {
        sVar7 = sVar9;
      }
      memcpy(outbuf,pcVar3,sVar7);
      outbuf[sVar7] = '\0';
      return bVar13;
    }
    html4_char = paVar12->html_cval;
  }
  os_xlat_html4(html4_char,outbuf,0x32);
  return bVar13;
}

Assistant:

static char out_parse_entity(char *outbuf, size_t outbuf_size,
                             char **sp, size_t *slenp)
{
    char  ampbuf[10];
    char *dst;
    char *orig_s;
    size_t orig_slen;
    const struct amp_tbl_t *ampptr;
    size_t lo, hi, cur;
    char  c;

    /* 
     *   remember where the part after the '&' begins, so we can come back
     *   here later if necessary 
     */
    orig_s = *sp;
    orig_slen = *slenp;

    /* get the character after the ampersand */
    c = nextout(sp, slenp);

    /* if it's numeric, parse the number */
    if (c == '#')
    {
        uint val;
        
        /* skip the '#' */
        c = nextout(sp, slenp);

        /* check for hex */
        if (c == 'x' || c == 'X')
        {
            /* skip the 'x' */
            c = nextout(sp, slenp);

            /* read the hex number */
            for (val = 0 ; isxdigit((uchar)c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 16;
                if (outisdg(c))
                    val += c - '0';
                else if (c >= 'a' && c <= 'f')
                    val += c - 'a' + 10;
                else
                    val += c - 'A' + 10;
            }
        }
        else
        {
            /* read the number */
            for (val = 0 ; outisdg(c) ; c = nextout(sp, slenp))
            {
                /* accumulate the current digit into the value */
                val *= 10;
                val += c - '0';
            }
        }
        
        /* if we found a ';' at the end, skip it */
        if (c == ';')
            c = nextout(sp, slenp);
        
        /* translate the character into the output buffer */
        os_xlat_html4(val, outbuf, outbuf_size);
        
        /* we're done with this character */
        return c;
    }

    /*
     *   Parse the sequence after the '&'.  Parse up to the closing
     *   semicolon, or any non-alphanumeric, or until we fill up the buffer.
     */
    for (dst = ampbuf ;
         c != '\0' && (outisdg(c) || outisal(c))
             && dst < ampbuf + sizeof(ampbuf) - 1 ;
         *dst++ = c, c = nextout(sp, slenp)) ;
    
    /* null-terminate the name */
    *dst = '\0';
    
    /* do a binary search for the name */
    lo = 0;
    hi = sizeof(amp_tbl)/sizeof(amp_tbl[0]) - 1;
    for (;;)
    {
        int diff;
        
        /* if we've converged, look no further */
        if (lo > hi || lo >= sizeof(amp_tbl)/sizeof(amp_tbl[0]))
        {
            ampptr = 0;
            break;
        }
        
        /* split the difference */
        cur = lo + (hi - lo)/2;
        ampptr = &amp_tbl[cur];
        
        /* see where we are relative to the target item */
        diff = strcmp(ampptr->cname, ampbuf);
        if (diff == 0)
        {
            /* this is it */
            break;
        }
        else if (diff > 0)
        {
            /* make sure we don't go off the end */
            if (cur == hi && cur == 0)
            {
                /* we've failed to find it */
                ampptr = 0;
                break;
            }
            
            /* this one is too high - check the lower half */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* this one is too low - check the upper half */
            lo = (cur == lo ? lo + 1 : cur);
        }
    }
    
    /* skip to the appropriate next character */
    if (c == ';')
    {
        /* name ended with semicolon - skip the semicolon */
        c = nextout(sp, slenp);
    }
    else if (ampptr != 0)
    {
        int skipcnt;
        
        /* found the name - skip its exact length */
        skipcnt = strlen(ampptr->cname);
        for (*sp = orig_s, *slenp = orig_slen ; skipcnt != 0 ;
             c = nextout(sp, slenp), --skipcnt) ;
    }
    
    /* if we found the entry, write out the character */
    if (ampptr != 0)
    {
        /* 
         *   if this one has an external mapping table entry, use the mapping
         *   table entry; otherwise, use the default OS routine mapping 
         */
        if (ampptr->expan != 0)
        {
            /* 
             *   we have an explicit expansion from the mapping table file -
             *   use it 
             */
            size_t copylen = strlen(ampptr->expan);
            if (copylen > outbuf_size - 1)
                copylen = outbuf_size - 1;

            memcpy(outbuf, ampptr->expan, copylen);
            outbuf[copylen] = '\0';
        }
        else
        {
            /* 
             *   there's no mapping table expansion - use the default OS code
             *   expansion 
             */
            os_xlat_html4(ampptr->html_cval, outbuf, outbuf_size);
        }
    }
    else
    {
        /* 
         *   didn't find it - output the '&' literally, then back up and
         *   output the entire sequence following 
         */
        *sp = orig_s;
        *slenp = orig_slen;
        c = nextout(sp, slenp);

        /* fill in the '&' return value */
        outbuf[0] = '&';
        outbuf[1] = '\0';
    }

    /* return the next character */
    return c;
}